

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cc
# Opt level: O3

string * bssl::PEMEncode(string *__return_storage_ptr__,string_view data,string *type)

{
  ulong uVar1;
  ulong uVar2;
  string b64_encoded;
  string local_60;
  string_view local_40;
  
  local_40._M_str = data._M_str;
  local_40._M_len = data._M_len;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  string_util::Base64Encode(&local_40,&local_60);
  uVar2 = local_60._M_string_length + 0x3f;
  uVar1 = uVar2 >> 6;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  ::std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             0x599bb8);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(type->_M_dataplus)._M_p);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__,0x599bc4);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (0x3f < uVar2) {
    uVar2 = 0;
    do {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)&local_60,uVar2);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = uVar2 + 0x40;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__,0x599bca);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(type->_M_dataplus)._M_p);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__,0x599bc4);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PEMEncode(std::string_view data, const std::string &type) {
  std::string b64_encoded;
  string_util::Base64Encode(data, &b64_encoded);

  // Divide the Base-64 encoded data into 64-character chunks, as per
  // 4.3.2.4 of RFC 1421.
  static const size_t kChunkSize = 64;
  size_t chunks = (b64_encoded.size() + (kChunkSize - 1)) / kChunkSize;

  std::string pem_encoded;
  pem_encoded.reserve(
      // header & footer
      17 + 15 + type.size() * 2 +
      // encoded data
      b64_encoded.size() +
      // newline characters for line wrapping in encoded data
      chunks);

  pem_encoded = kPEMHeaderBeginBlock;
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");

  for (size_t i = 0, chunk_offset = 0; i < chunks;
       ++i, chunk_offset += kChunkSize) {
    pem_encoded.append(b64_encoded, chunk_offset, kChunkSize);
    pem_encoded.append("\n");
  }

  pem_encoded.append(kPEMHeaderEndBlock);
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");
  return pem_encoded;
}